

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

vm_obj_id_t CVmObjFrameRef::create(vm_val_t *fp,uchar *entry)

{
  vm_obj_id_t obj_id;
  CVmObjFrameRef *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  this = (CVmObjFrameRef *)CVmObject::operator_new(0x10,obj_id);
  CVmObjFrameRef(this,fp,entry);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFrameRef::create(
    VMG_ vm_val_t *fp, const uchar *entry)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* instantiate the new object */
    new (vmg_ id) CVmObjFrameRef(vmg_ fp, entry);

    /* return the new object's ID */
    return id;
}